

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

void wabt::anon_unknown_17::NameGenerator::GenerateName
               (char *prefix,Index index,uint disambiguator,string *str)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_40;
  string *local_20;
  string *str_local;
  uint disambiguator_local;
  Index index_local;
  char *prefix_local;
  
  local_20 = str;
  str_local._0_4_ = disambiguator;
  str_local._4_4_ = index;
  _disambiguator_local = prefix;
  std::__cxx11::string::operator=((string *)str,prefix);
  if (str_local._4_4_ != 0xffffffff) {
    std::__cxx11::to_string(&local_40,str_local._4_4_);
    std::__cxx11::string::operator+=((string *)local_20,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((uint)str_local != 0) {
    std::__cxx11::to_string(&local_90,(uint)str_local);
    std::operator+(&local_70,'_',&local_90);
    std::__cxx11::string::operator+=((string *)local_20,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void NameGenerator::GenerateName(const char* prefix,
                                 Index index,
                                 unsigned disambiguator,
                                 std::string* str) {
  *str = prefix;
  if (index != kInvalidIndex) {
    *str += std::to_string(index);
  }
  if (disambiguator != 0) {
    *str += '_' + std::to_string(disambiguator);
  }
}